

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::AddSubOp> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::AddSubOp>(RecursiveDescentParser *this)

{
  socklen_t *in_RCX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::AddSubOp> sVar1;
  
  std::make_shared<MyCompiler::AddSubOp>();
  std::__cxx11::string::assign((char *)(this->stream + 0x28));
  accept(in_RSI,in_RSI->sym,__addr,in_RCX);
  sVar1.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::AddSubOp>)
         sVar1.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::AddSubOp> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<AddSubOp>();

    switch (sym)
    {
        case SymbolType::PLUS:
            pResult->value = "+";
            break;
        default: // case SymbolType::MINUS:
            pResult->value = "-";
    }
    accept(sym);

    return pResult;
}